

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O3

void jsonrpccxx::check_param_type<Product>(size_t index,json *x,value_t expectedType,type *param_4)

{
  JsonRpcException *this;
  long *plVar1;
  size_type *psVar2;
  value_t t;
  size_t local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (x->m_type == expectedType) {
    return;
  }
  local_d8 = index;
  this = (JsonRpcException *)__cxa_allocate_exception(0x60);
  type_name_abi_cxx11_(&local_b0,(jsonrpccxx *)(ulong)expectedType,t);
  std::operator+(&local_60,"invalid parameter: must be ",&local_b0);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_d0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar2) {
    local_d0.field_2._M_allocated_capacity = *psVar2;
    local_d0.field_2._8_8_ = plVar1[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar2;
  }
  local_d0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  type_name_abi_cxx11_(&local_80,(jsonrpccxx *)(ulong)x->m_type,(value_t)local_d0._M_string_length);
  std::operator+(&local_40,&local_d0,&local_80);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_90,&local_d8);
  JsonRpcException::JsonRpcException(this,-0x7f5a,&local_40,&local_90);
  __cxa_throw(this,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
}

Assistant:

inline void check_param_type(size_t index, const json &x, json::value_t expectedType, typename std::enable_if<!std::is_arithmetic<T>::value>::type * = 0) {
    if (x.type() != expectedType) {
      throw JsonRpcException(invalid_params, "invalid parameter: must be " + type_name(expectedType) + ", but is " + type_name(x.type()), index);
    }
  }